

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O2

void helper_gvec_sar32v_aarch64(void *d,void *a,void *b,uint32_t desc)

{
  ulong oprsz;
  ulong uVar1;
  
  oprsz = (ulong)((desc & 0x1f) * 8 + 8);
  for (uVar1 = 0; uVar1 < oprsz; uVar1 = uVar1 + 4) {
    *(int *)((long)d + uVar1) = *(int *)((long)a + uVar1) >> (*(byte *)((long)b + uVar1) & 0x1f);
  }
  clear_high(d,oprsz,desc);
  return;
}

Assistant:

void HELPER(gvec_sar32v)(void *d, void *a, void *b, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(int32_t)) {
        uint8_t sh = *(uint32_t *)((char *)b + i) & 31;
        *(int32_t *)((char *)d + i) = *(int32_t *)((char *)a + i) >> sh;
    }
    clear_high(d, oprsz, desc);
}